

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FieldOptions::SharedCtor(FieldOptions *this)

{
  FieldOptions *this_local;
  
  this->_cached_size_ = 0;
  memset(&this->ctype_,0,0xc);
  return;
}

Assistant:

void FieldOptions::SharedCtor() {
  _cached_size_ = 0;
  ::memset(&ctype_, 0, reinterpret_cast<char*>(&jstype_) -
    reinterpret_cast<char*>(&ctype_) + sizeof(jstype_));
}